

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O1

void __thiscall NaNNUnit::PrintLog(NaNNUnit *this)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  NaReal NVar7;
  NaReal NVar8;
  
  NaPrintLog("NaNNUnit(this=%p):\n  includes ",this);
  NaNeuralNetDescr::PrintLog(&this->descr);
  NaUnit::PrintLog(&this->super_NaUnit);
  NaPrintLog("  network has the next tunable parameters:\n");
  uVar6 = 0;
  do {
    plVar1 = (long *)(&this->field_0xf8 + uVar6 * 0x18);
    uVar2 = (**(code **)(*plVar1 + 0x38))(plVar1);
    uVar3 = (**(code **)(*plVar1 + 0x30))(plVar1);
    NaPrintLog("  * layer #%u (%u inputs, %u neurons)\n",uVar6,(ulong)uVar2,(ulong)uVar3);
    iVar4 = (**(code **)(*plVar1 + 0x30))(plVar1);
    if (iVar4 != 0) {
      uVar2 = 0;
      do {
        (**(code **)(*(long *)(&this->field_0x200 + uVar6 * 0x18) + 0x50))
                  (&this->field_0x200 + uVar6 * 0x18,uVar2);
        NaPrintLog("    * neuron #%u (bias / weights)\n      %+7.3f /",(ulong)uVar2);
        iVar4 = (**(code **)(*plVar1 + 0x38))(plVar1);
        if (iVar4 != 0) {
          uVar3 = 0;
          do {
            (**(code **)(*plVar1 + 0x58))(plVar1,uVar2,uVar3);
            NaPrintLog("\t%+6.3f");
            uVar3 = uVar3 + 1;
            uVar5 = (**(code **)(*plVar1 + 0x38))(plVar1);
          } while (uVar3 < uVar5);
        }
        NaPrintLog("\n");
        uVar2 = uVar2 + 1;
        uVar3 = (**(code **)(*plVar1 + 0x30))(plVar1);
      } while (uVar2 < uVar3);
    }
    uVar2 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar2;
  } while (uVar2 <= (this->descr).nHidLayers);
  uVar2 = 0;
  NaPrintLog("  defined scale for output layer:\n");
  iVar4 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[10])(this);
  if (iVar4 != 0) {
    do {
      NVar7 = NaVector::operator()(&(this->OutputScaler).min,uVar2);
      NVar8 = NaVector::operator()(&(this->OutputScaler).max,uVar2);
      NaPrintLog("    * neuron #%u\tmin=%g\tmax=%g\n",NVar7,SUB84(NVar8,0),(ulong)uVar2);
      uVar2 = uVar2 + 1;
      uVar3 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[10])(this);
    } while (uVar2 < uVar3);
  }
  return;
}

Assistant:

void
NaNNUnit::PrintLog () const
{
    unsigned    iLayer, iNeuron, iInput;

    NaPrintLog("NaNNUnit(this=%p):\n  includes ", this);
    descr.PrintLog();
    NaUnit::PrintLog();
    NaPrintLog("  network has the next tunable parameters:\n");

    for(iLayer = InputLayer(); iLayer <= OutputLayer(); ++iLayer){
        NaPrintLog("  * layer #%u (%u inputs, %u neurons)\n", iLayer,
                   weight[iLayer].dim_cols(),
                   weight[iLayer].dim_rows());
        for(iNeuron = 0; iNeuron < weight[iLayer].dim_rows(); ++iNeuron){
            NaPrintLog("    * neuron #%u (bias / weights)\n      %+7.3f /",
                       iNeuron, bias[iLayer](iNeuron));
            for(iInput = 0; iInput < weight[iLayer].dim_cols(); ++iInput){
                NaPrintLog("\t%+6.3f", weight[iLayer](iNeuron, iInput));
            }// for inputs of neuron
            NaPrintLog("\n");
        }// for neurons of layer
    }// for layers

    NaPrintLog("  defined scale for output layer:\n");

    for(iNeuron = 0; iNeuron < (unsigned)OutputDim(); ++iNeuron){
        NaPrintLog("    * neuron #%u\tmin=%g\tmax=%g\n", iNeuron,
                   OutputScaler.min(iNeuron), OutputScaler.max(iNeuron));
    }
}